

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O1

spv_result_t
spvtools::val::FindCaseFallThrough
          (ValidationState_t *_,BasicBlock *target_block,uint32_t *case_fall_through,
          BasicBlock *merge,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *case_targets,Function *function)

{
  bool bVar1;
  pointer ppBVar2;
  ValidationState_t *pVVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  bool bVar7;
  spv_result_t sVar8;
  pointer ppBVar9;
  pair<std::__detail::_Node_iterator<const_spvtools::val::BasicBlock_*,_true,_false>,_bool> pVar10;
  value_type block;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> stack;
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  visited;
  BasicBlock *successor;
  BasicBlock *local_300;
  BasicBlock *local_2f8;
  spv_result_t local_2ec;
  BasicBlock **local_2e8;
  iterator iStack_2e0;
  BasicBlock **local_2d8;
  uint32_t *local_2c8;
  int local_2bc;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2b8;
  Function *local_2b0;
  ValidationState_t *local_2a8;
  string local_2a0;
  string local_280;
  string local_260;
  undefined1 local_240 [40];
  pointer local_218;
  __node_base_ptr p_Stack_210;
  BasicBlock *local_208 [58];
  spv_result_t local_38;
  
  local_2e8 = (BasicBlock **)0x0;
  iStack_2e0._M_current = (BasicBlock **)0x0;
  local_2d8 = (BasicBlock **)0x0;
  local_2f8 = target_block;
  local_2c8 = case_fall_through;
  local_2a8 = _;
  std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
  _M_realloc_insert<spvtools::val::BasicBlock*const&>
            ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
             &local_2e8,(iterator)0x0,&local_2f8);
  local_240._0_8_ = &p_Stack_210;
  local_240._8_8_ = (BasicBlock *)0x1;
  local_240._16_8_ = (BasicBlock *)0x0;
  local_240._24_8_ = (BasicBlock *)0x0;
  local_240._32_4_ = 1.0;
  local_218 = (pointer)0x0;
  p_Stack_210 = (__node_base_ptr)0x0;
  bVar1 = local_2f8->structurally_reachable_;
  local_2bc = Function::GetBlockDepth(function,local_2f8);
  sVar8 = SPV_SUCCESS;
  if (local_2e8 != iStack_2e0._M_current) {
    do {
      local_300 = iStack_2e0._M_current[-1];
      iStack_2e0._M_current = iStack_2e0._M_current + -1;
      bVar7 = false;
      if ((local_300 != merge) &&
         (local_208[0] = (BasicBlock *)local_240,
         pVar10 = std::
                  _Hashtable<spvtools::val::BasicBlock_const*,spvtools::val::BasicBlock_const*,std::allocator<spvtools::val::BasicBlock_const*>,std::__detail::_Identity,std::equal_to<spvtools::val::BasicBlock_const*>,std::hash<spvtools::val::BasicBlock_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<spvtools::val::BasicBlock_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::val::BasicBlock_const*,false>>>>
                            ((_Hashtable<spvtools::val::BasicBlock_const*,spvtools::val::BasicBlock_const*,std::allocator<spvtools::val::BasicBlock_const*>,std::__detail::_Identity,std::equal_to<spvtools::val::BasicBlock_const*>,std::hash<spvtools::val::BasicBlock_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_240,&local_300,(DiagnosticStream *)local_208),
         ((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        if ((bVar1 == false) ||
           ((local_300->structurally_reachable_ != true ||
            (bVar4 = BasicBlock::structurally_dominates(local_2f8,local_300), !bVar4)))) {
          local_208[0] = (BasicBlock *)CONCAT44(local_208[0]._4_4_,local_300->id_);
          sVar6 = std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&case_targets->_M_h,(key_type_conflict *)local_208);
          pVVar3 = local_2a8;
          if (sVar6 == 0) {
            iVar5 = Function::GetBlockDepth(function,local_300);
            pVVar3 = local_2a8;
            if ((local_2bc <= iVar5) &&
               ((iVar5 != local_2bc ||
                (((local_300->type_).super__Base_bitset<1UL>._M_w & 0x20) == 0)))) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,local_2a8,SPV_ERROR_INVALID_CFG,
                         local_2f8->label_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Case construct that targets ",0x1c);
              ValidationState_t::getIdName_abi_cxx11_(&local_280,pVVar3,local_2f8->id_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_280._M_dataplus._M_p,local_280._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," has invalid branch to block ",0x1d);
              ValidationState_t::getIdName_abi_cxx11_(&local_2a0,pVVar3,local_300->id_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_2a0._M_dataplus._M_p,local_2a0._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,
                         " (not another case construct, corresponding merge, outer loop merge or outer loop continue)"
                         ,0x5b);
              local_2ec = local_38;
LAB_001adc4c:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p != &local_280.field_2) {
                operator_delete(local_280._M_dataplus._M_p,
                                local_280.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              bVar7 = true;
            }
          }
          else if (*local_2c8 == 0) {
            bVar7 = false;
            if (local_2f8 != local_300) {
              *local_2c8 = local_300->id_;
              bVar7 = false;
            }
          }
          else {
            bVar7 = false;
            if (*local_2c8 != local_300->id_) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,local_2a8,SPV_ERROR_INVALID_CFG,
                         local_2f8->label_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Case construct that targets ",0x1c);
              ValidationState_t::getIdName_abi_cxx11_(&local_280,pVVar3,local_2f8->id_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_280._M_dataplus._M_p,local_280._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,
                         " has branches to multiple other case construct targets ",0x37);
              ValidationState_t::getIdName_abi_cxx11_(&local_2a0,pVVar3,*local_2c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_2a0._M_dataplus._M_p,local_2a0._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," and ",5);
              ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar3,local_300->id_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_260._M_dataplus._M_p,local_260._M_string_length)
              ;
              local_2ec = local_38;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              goto LAB_001adc4c;
            }
          }
        }
        else {
          ppBVar2 = (local_300->successors_).
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          bVar7 = false;
          ppBVar9 = (local_300->successors_).
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_2b8 = &case_targets->_M_h;
          local_2b0 = function;
          for (; case_targets = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)local_2b8, function = local_2b0, ppBVar9 != ppBVar2;
              ppBVar9 = ppBVar9 + 1) {
            local_208[0] = *ppBVar9;
            if (iStack_2e0._M_current == local_2d8) {
              std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
              _M_realloc_insert<spvtools::val::BasicBlock*const&>
                        ((vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>
                          *)&local_2e8,iStack_2e0,local_208);
            }
            else {
              *iStack_2e0._M_current = local_208[0];
              iStack_2e0._M_current = iStack_2e0._M_current + 1;
            }
          }
        }
      }
      sVar8 = local_2ec;
      if (bVar7) goto LAB_001adce0;
    } while (local_2e8 != iStack_2e0._M_current);
    sVar8 = SPV_SUCCESS;
  }
LAB_001adce0:
  std::
  _Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_240);
  if (local_2e8 != (BasicBlock **)0x0) {
    operator_delete(local_2e8,(long)local_2d8 - (long)local_2e8);
  }
  return sVar8;
}

Assistant:

spv_result_t FindCaseFallThrough(
    ValidationState_t& _, BasicBlock* target_block, uint32_t* case_fall_through,
    const BasicBlock* merge, const std::unordered_set<uint32_t>& case_targets,
    Function* function) {
  std::vector<BasicBlock*> stack;
  stack.push_back(target_block);
  std::unordered_set<const BasicBlock*> visited;
  bool target_reachable = target_block->structurally_reachable();
  int target_depth = function->GetBlockDepth(target_block);
  while (!stack.empty()) {
    auto block = stack.back();
    stack.pop_back();

    if (block == merge) continue;

    if (!visited.insert(block).second) continue;

    if (target_reachable && block->structurally_reachable() &&
        target_block->structurally_dominates(*block)) {
      // Still in the case construct.
      for (auto successor : *block->successors()) {
        stack.push_back(successor);
      }
    } else {
      // Exiting the case construct to non-merge block.
      if (!case_targets.count(block->id())) {
        int depth = function->GetBlockDepth(block);
        if ((depth < target_depth) ||
            (depth == target_depth && block->is_type(kBlockTypeContinue))) {
          continue;
        }

        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has invalid branch to block " << _.getIdName(block->id())
               << " (not another case construct, corresponding merge, outer "
                  "loop merge or outer loop continue)";
      }

      if (*case_fall_through == 0u) {
        if (target_block != block) {
          *case_fall_through = block->id();
        }
      } else if (*case_fall_through != block->id()) {
        // Case construct has at most one branch to another case construct.
        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has branches to multiple other case construct targets "
               << _.getIdName(*case_fall_through) << " and "
               << _.getIdName(block->id());
      }
    }
  }

  return SPV_SUCCESS;
}